

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

void boost::filesystem::detail::copy_symlink
               (path *existing_symlink,path *new_symlink,error_code *ec)

{
  path p;
  path local_30;
  
  read_symlink(&local_30,existing_symlink,ec);
  if ((ec == (error_code *)0x0) || (ec->m_val == 0)) {
    create_symlink(&local_30,new_symlink,ec);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void copy_symlink(const path& existing_symlink, const path& new_symlink,
    system::error_code* ec)
  {
# if defined(_WIN32_WINNT) && _WIN32_WINNT < 0x0600
    error(BOOST_ERROR_NOT_SUPPORTED, new_symlink, existing_symlink, ec,
      "boost::filesystem::copy_symlink");

# else  // modern Windows or BOOST_POSIX_API 
    path p(read_symlink(existing_symlink, ec));
    if (ec != 0 && *ec) return;
    create_symlink(p, new_symlink, ec);

# endif
  }